

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fontstash.h
# Opt level: O3

void fonsPushState(FONScontext *stash)

{
  FONSstate *pFVar1;
  undefined8 uVar2;
  FONSstate *pFVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  iVar9 = stash->nstates;
  lVar10 = (long)iVar9;
  if (lVar10 < 0x14) {
    if (0 < iVar9) {
      pFVar1 = stash->states + (iVar9 - 1U);
      iVar5 = pFVar1->font;
      iVar6 = pFVar1->align;
      fVar7 = pFVar1->size;
      iVar8 = pFVar1->blurType;
      pFVar1 = stash->states + (iVar9 - 1U);
      fVar4 = pFVar1->blur;
      uVar2 = *(undefined8 *)(&pFVar1->color + 2);
      pFVar3 = stash->states + lVar10;
      pFVar3->color = pFVar1->color;
      pFVar3->blur = fVar4;
      *(undefined8 *)(&pFVar3->color + 2) = uVar2;
      pFVar1 = stash->states + lVar10;
      pFVar1->font = iVar5;
      pFVar1->align = iVar6;
      pFVar1->size = fVar7;
      pFVar1->blurType = iVar8;
      iVar9 = stash->nstates;
    }
    stash->nstates = iVar9 + 1;
  }
  else if (stash->handleError != (_func_void_void_ptr_int_int *)0x0) {
    (*stash->handleError)(stash->errorUptr,3,0);
    return;
  }
  return;
}

Assistant:

void fonsPushState(FONScontext* stash) {
    if (stash->nstates >= FONS_MAX_STATES) {
        if (stash->handleError)
            stash->handleError(stash->errorUptr, FONS_STATES_OVERFLOW, 0);
        return;
    }
    if (stash->nstates > 0)
        memcpy(&stash->states[stash->nstates], &stash->states[stash->nstates-1], sizeof(FONSstate));
    stash->nstates++;
}